

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int PutCoeffs(VP8BitWriter *bw,int ctx,VP8Residual *res)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  ProbaArray *paauVar4;
  int iVar5;
  ushort uVar6;
  uint8_t *puVar7;
  uint uVar8;
  uint8_t (*pauVar9) [11];
  long lVar10;
  long lVar11;
  uint uVar12;
  
  lVar10 = (long)res->first;
  paauVar4 = res->prob;
  iVar5 = VP8PutBit(bw,(uint)~res->last >> 0x1f,(uint)paauVar4[lVar10][ctx][0]);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    pauVar9 = paauVar4[lVar10] + ctx;
    do {
      while( true ) {
        if (0xf < lVar10) goto LAB_00129261;
        lVar1 = lVar10 + 1;
        uVar3 = res->coeffs[lVar10];
        uVar6 = -uVar3;
        if (0 < (short)uVar3) {
          uVar6 = uVar3;
        }
        iVar5 = VP8PutBit(bw,(uint)(uVar3 != 0),(uint)(*pauVar9)[1]);
        if (iVar5 != 0) break;
        pauVar9 = res->prob[""[lVar10 + 1]];
        lVar10 = lVar1;
      }
      iVar5 = VP8PutBit(bw,(uint)(1 < uVar6),(uint)(*pauVar9)[2]);
      lVar11 = 1;
      if (iVar5 != 0) {
        iVar5 = VP8PutBit(bw,(uint)(4 < uVar6),(uint)(*pauVar9)[3]);
        if (iVar5 == 0) {
          iVar5 = VP8PutBit(bw,(uint)(uVar6 != 2),(uint)(*pauVar9)[4]);
          lVar11 = 2;
          if (iVar5 != 0) {
            uVar8 = (uint)(uVar6 == 4);
            uVar12 = (uint)(*pauVar9)[5];
            goto LAB_001291b2;
          }
        }
        else {
          iVar5 = VP8PutBit(bw,(uint)(10 < uVar6),(uint)(*pauVar9)[6]);
          uVar12 = (uint)uVar6;
          if (iVar5 == 0) {
            iVar5 = VP8PutBit(bw,(uint)(6 < uVar6),(uint)(*pauVar9)[7]);
            if (iVar5 == 0) {
              uVar8 = (uint)(uVar12 == 6);
              uVar12 = 0x9f;
            }
            else {
              VP8PutBit(bw,(uint)(8 < uVar6),0xa5);
              uVar8 = ~uVar12 & 1;
              uVar12 = 0x91;
            }
LAB_001291b2:
            VP8PutBit(bw,uVar8,uVar12);
          }
          else {
            if (uVar6 < 0x13) {
              VP8PutBit(bw,0,(uint)(*pauVar9)[8]);
              VP8PutBit(bw,0,(uint)(*pauVar9)[9]);
              iVar5 = -0xb;
              uVar8 = 4;
              puVar7 = VP8Cat3;
            }
            else if (uVar6 < 0x23) {
              VP8PutBit(bw,0,(uint)(*pauVar9)[8]);
              VP8PutBit(bw,1,(uint)(*pauVar9)[9]);
              iVar5 = -0x13;
              uVar8 = 8;
              puVar7 = VP8Cat4;
            }
            else {
              VP8PutBit(bw,1,(uint)(*pauVar9)[8]);
              if (uVar6 < 0x43) {
                VP8PutBit(bw,0,(uint)(*pauVar9)[10]);
                iVar5 = -0x23;
                uVar8 = 0x10;
                puVar7 = VP8Cat5;
              }
              else {
                VP8PutBit(bw,1,(uint)(*pauVar9)[10]);
                uVar8 = 0x400;
                iVar5 = -0x43;
                puVar7 = VP8Cat6;
              }
            }
            for (; uVar8 != 0; uVar8 = uVar8 >> 1) {
              bVar2 = *puVar7;
              puVar7 = puVar7 + 1;
              VP8PutBit(bw,(uint)((uVar8 & iVar5 + uVar12) != 0),(uint)bVar2);
            }
          }
          lVar11 = 2;
        }
      }
      paauVar4 = res->prob;
      bVar2 = ""[lVar10 + 1];
      VP8PutBitUniform(bw,(uint)(uVar3 >> 0xf));
      if (lVar1 == 0x10) break;
      pauVar9 = paauVar4[bVar2] + lVar11;
      iVar5 = VP8PutBit(bw,(uint)(lVar10 < res->last),(uint)paauVar4[bVar2][lVar11][0]);
      lVar10 = lVar1;
    } while (iVar5 != 0);
LAB_00129261:
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int PutCoeffs(VP8BitWriter* const bw, int ctx, const VP8Residual* res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const uint8_t* p = res->prob[n][ctx];
  if (!VP8PutBit(bw, res->last >= 0, p[0])) {
    return 0;
  }

  while (n < 16) {
    const int c = res->coeffs[n++];
    const int sign = c < 0;
    int v = sign ? -c : c;
    if (!VP8PutBit(bw, v != 0, p[1])) {
      p = res->prob[VP8EncBands[n]][0];
      continue;
    }
    if (!VP8PutBit(bw, v > 1, p[2])) {
      p = res->prob[VP8EncBands[n]][1];
    } else {
      if (!VP8PutBit(bw, v > 4, p[3])) {
        if (VP8PutBit(bw, v != 2, p[4])) {
          VP8PutBit(bw, v == 4, p[5]);
        }
      } else if (!VP8PutBit(bw, v > 10, p[6])) {
        if (!VP8PutBit(bw, v > 6, p[7])) {
          VP8PutBit(bw, v == 6, 159);
        } else {
          VP8PutBit(bw, v >= 9, 165);
          VP8PutBit(bw, !(v & 1), 145);
        }
      } else {
        int mask;
        const uint8_t* tab;
        if (v < 3 + (8 << 1)) {          // VP8Cat3  (3b)
          VP8PutBit(bw, 0, p[8]);
          VP8PutBit(bw, 0, p[9]);
          v -= 3 + (8 << 0);
          mask = 1 << 2;
          tab = VP8Cat3;
        } else if (v < 3 + (8 << 2)) {   // VP8Cat4  (4b)
          VP8PutBit(bw, 0, p[8]);
          VP8PutBit(bw, 1, p[9]);
          v -= 3 + (8 << 1);
          mask = 1 << 3;
          tab = VP8Cat4;
        } else if (v < 3 + (8 << 3)) {   // VP8Cat5  (5b)
          VP8PutBit(bw, 1, p[8]);
          VP8PutBit(bw, 0, p[10]);
          v -= 3 + (8 << 2);
          mask = 1 << 4;
          tab = VP8Cat5;
        } else {                         // VP8Cat6 (11b)
          VP8PutBit(bw, 1, p[8]);
          VP8PutBit(bw, 1, p[10]);
          v -= 3 + (8 << 3);
          mask = 1 << 10;
          tab = VP8Cat6;
        }
        while (mask) {
          VP8PutBit(bw, !!(v & mask), *tab++);
          mask >>= 1;
        }
      }
      p = res->prob[VP8EncBands[n]][2];
    }
    VP8PutBitUniform(bw, sign);
    if (n == 16 || !VP8PutBit(bw, n <= res->last, p[0])) {
      return 1;   // EOB
    }
  }
  return 1;
}